

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryOperatorWrapper,duckdb::TryAbsOperator>
               (hugeint_t *ldata,hugeint_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  sel_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  hugeint_t input;
  element_type *peVar3;
  ulong uVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  _Head_base<0UL,_unsigned_long_*,_false> _Var6;
  idx_t idx_in_entry;
  ulong uVar7;
  idx_t iVar8;
  int64_t *piVar9;
  hugeint_t hVar10;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffb0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int64_t in_stack_ffffffffffffffb8;
  buffer_ptr<ValidityBuffer> *this_01;
  idx_t local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      piVar9 = &result_data->upper;
      iVar8 = 0;
      do {
        hVar10.upper = in_stack_ffffffffffffffb8;
        hVar10.lower = (uint64_t)in_stack_ffffffffffffffb0;
        hVar10 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hVar10);
        ((hugeint_t *)(piVar9 + -1))->lower = hVar10.lower;
        *piVar9 = hVar10.upper;
        iVar8 = iVar8 + 1;
        piVar9 = piVar9 + 2;
      } while (count != iVar8);
    }
  }
  else if (count != 0) {
    psVar1 = sel_vector->sel_vector;
    this_01 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    piVar9 = &result_data->upper;
    uVar7 = 0;
    do {
      uVar4 = uVar7;
      if (psVar1 != (sel_t *)0x0) {
        uVar4 = (ulong)psVar1[uVar7];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar4 >> 6] >>
           (uVar4 & 0x3f) & 1) == 0) {
        _Var6._M_head_impl = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
        ;
        this_00 = in_stack_ffffffffffffffb0;
        if (_Var6._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          peVar3 = local_58;
          local_58 = (element_type *)0x0;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar3;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = in_stack_ffffffffffffffb0;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (this_01);
          _Var6._M_head_impl =
               (pTVar5->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var6._M_head_impl;
        }
        bVar2 = (byte)uVar7 & 0x3f;
        _Var6._M_head_impl[uVar7 >> 6] =
             _Var6._M_head_impl[uVar7 >> 6] & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      else {
        input.upper = (int64_t)this_01;
        input.lower = (uint64_t)in_stack_ffffffffffffffb0;
        hVar10 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input);
        ((hugeint_t *)(piVar9 + -1))->lower = hVar10.lower;
        *piVar9 = hVar10.upper;
        this_00 = in_stack_ffffffffffffffb0;
      }
      uVar7 = uVar7 + 1;
      piVar9 = piVar9 + 2;
      in_stack_ffffffffffffffb0 = this_00;
    } while (count != uVar7);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}